

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

inform_dist * inform_dist_create(uint32_t *data,size_t n)

{
  void *pvVar1;
  ulong local_30;
  size_t i;
  inform_dist *dist;
  size_t n_local;
  uint32_t *data_local;
  
  if ((data == (uint32_t *)0x0) || (n == 0)) {
    data_local = (uint32_t *)0x0;
  }
  else {
    i = (size_t)malloc(0x18);
    if ((long *)i != (long *)0x0) {
      pvVar1 = calloc(n,4);
      *(void **)i = pvVar1;
      if (*(long *)i == 0) {
        free((void *)i);
        i = 0;
      }
      else {
        memcpy(*(void **)i,data,n << 2);
        *(size_t *)(i + 8) = n;
        *(long *)(i + 0x10) = 0;
        for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
          *(ulong *)(i + 0x10) = (ulong)*(uint *)(*(long *)i + local_30 * 4) + *(long *)(i + 0x10);
        }
      }
    }
    data_local = (uint32_t *)i;
  }
  return (inform_dist *)data_local;
}

Assistant:

inform_dist* inform_dist_create(uint32_t const *data, size_t n)
{
    // if the requested support size is zero, return NULL
    if (data == NULL || n == 0)
    {
        return NULL;
    }
    // allocate the distribution
    inform_dist *dist = malloc(sizeof(inform_dist));
    // if the allocation succeeded
    if (dist != NULL)
    {
        // allocate the underlying histogram
        dist->histogram = calloc(n, sizeof(uint32_t));
        // if the allocation succeeded
        if (dist->histogram != NULL)
        {
            // set the distribution content, size and counts
            memcpy(dist->histogram, data, n*sizeof(uint32_t));
            dist->size   = n;
            dist->counts = 0;
            for (size_t i = 0; i < n; ++i)
            {
                dist->counts += dist->histogram[i];
            }
        }
        // otherwise free the distribution
        else
        {
            free(dist);
            dist = NULL;
        }
    }
    // return the (potentially NULL) distribution
    return dist;
}